

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindCommon.cxx
# Opt level: O0

bool __thiscall cmFindCommon::CheckCommonArgument(cmFindCommon *this,string *arg)

{
  bool bVar1;
  string *arg_local;
  cmFindCommon *this_local;
  
  bVar1 = std::operator==(arg,"NO_DEFAULT_PATH");
  if (bVar1) {
    this->NoDefaultPath = true;
  }
  else {
    bVar1 = std::operator==(arg,"NO_CMAKE_ENVIRONMENT_PATH");
    if (bVar1) {
      this->NoCMakeEnvironmentPath = true;
    }
    else {
      bVar1 = std::operator==(arg,"NO_CMAKE_PATH");
      if (bVar1) {
        this->NoCMakePath = true;
      }
      else {
        bVar1 = std::operator==(arg,"NO_SYSTEM_ENVIRONMENT_PATH");
        if (bVar1) {
          this->NoSystemEnvironmentPath = true;
        }
        else {
          bVar1 = std::operator==(arg,"NO_CMAKE_SYSTEM_PATH");
          if (bVar1) {
            this->NoCMakeSystemPath = true;
          }
          else {
            bVar1 = std::operator==(arg,"NO_CMAKE_FIND_ROOT_PATH");
            if (bVar1) {
              this->FindRootPathMode = RootPathModeNever;
            }
            else {
              bVar1 = std::operator==(arg,"ONLY_CMAKE_FIND_ROOT_PATH");
              if (bVar1) {
                this->FindRootPathMode = RootPathModeOnly;
              }
              else {
                bVar1 = std::operator==(arg,"CMAKE_FIND_ROOT_PATH_BOTH");
                if (!bVar1) {
                  return false;
                }
                this->FindRootPathMode = RootPathModeBoth;
              }
            }
          }
        }
      }
    }
  }
  return true;
}

Assistant:

bool cmFindCommon::CheckCommonArgument(std::string const& arg)
{
  if(arg == "NO_DEFAULT_PATH")
    {
    this->NoDefaultPath = true;
    }
  else if(arg == "NO_CMAKE_ENVIRONMENT_PATH")
    {
    this->NoCMakeEnvironmentPath = true;
    }
  else if(arg == "NO_CMAKE_PATH")
    {
    this->NoCMakePath = true;
    }
  else if(arg == "NO_SYSTEM_ENVIRONMENT_PATH")
    {
    this->NoSystemEnvironmentPath = true;
    }
  else if(arg == "NO_CMAKE_SYSTEM_PATH")
    {
    this->NoCMakeSystemPath = true;
    }
    else if(arg == "NO_CMAKE_FIND_ROOT_PATH")
    {
    this->FindRootPathMode = RootPathModeNever;
    }
  else if(arg == "ONLY_CMAKE_FIND_ROOT_PATH")
    {
    this->FindRootPathMode = RootPathModeOnly;
    }
  else if(arg == "CMAKE_FIND_ROOT_PATH_BOTH")
    {
    this->FindRootPathMode = RootPathModeBoth;
    }
  else
    {
    // The argument is not one of the above.
    return false;
    }

  // The argument is one of the above.
  return true;
}